

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

LY_ERR lyd_dup_ctx_check(lyd_node *node,lyd_node_inner *parent)

{
  lyd_node *plVar1;
  bool bVar2;
  ly_ctx *local_68;
  ly_ctx *local_60;
  ly_ctx *local_50;
  ly_ctx *local_40;
  ly_ctx *local_30;
  lyd_node *local_28;
  lyd_node *iter;
  lyd_node_inner *parent_local;
  lyd_node *node_local;
  
  if ((node == (lyd_node *)0x0) || (parent == (lyd_node_inner *)0x0)) {
    return LY_SUCCESS;
  }
  if (node->schema == (lysc_node *)0x0) {
    local_30 = (ly_ctx *)node[2].schema;
  }
  else {
    local_30 = node->schema->module->ctx;
  }
  if ((parent->field_0).node.schema == (lysc_node *)0x0) {
    local_40 = (ly_ctx *)parent[1].field_0.node.priv;
  }
  else {
    local_40 = ((parent->field_0).node.schema)->module->ctx;
  }
  local_28 = node;
  if (local_30 == local_40) {
LAB_0012ebd4:
    node_local._4_4_ = LY_SUCCESS;
  }
  else {
    while( true ) {
      bVar2 = false;
      if (local_28 != (lyd_node *)0x0) {
        bVar2 = (local_28->flags & 8) == 0;
      }
      if (!bVar2) break;
      local_28 = lyd_parent(local_28);
    }
    if ((local_28 != (lyd_node *)0x0) && (plVar1 = lyd_parent(local_28), plVar1 != (lyd_node *)0x0))
    {
      plVar1 = lyd_parent(local_28);
      if (plVar1->schema == (lysc_node *)0x0) {
        plVar1 = lyd_parent(local_28);
        local_50 = (ly_ctx *)plVar1[2].schema;
      }
      else {
        plVar1 = lyd_parent(local_28);
        local_50 = plVar1->schema->module->ctx;
      }
      if ((parent->field_0).node.schema == (lysc_node *)0x0) {
        local_60 = (ly_ctx *)parent[1].field_0.node.priv;
      }
      else {
        local_60 = ((parent->field_0).node.schema)->module->ctx;
      }
      if (local_50 == local_60) goto LAB_0012ebd4;
    }
    if (node->schema == (lysc_node *)0x0) {
      local_68 = (ly_ctx *)node[2].schema;
    }
    else {
      local_68 = node->schema->module->ctx;
    }
    ly_log(local_68,LY_LLERR,LY_EINVAL,"Different contexts used in node duplication.");
    node_local._4_4_ = LY_EINVAL;
  }
  return node_local._4_4_;
}

Assistant:

static LY_ERR
lyd_dup_ctx_check(const struct lyd_node *node, const struct lyd_node_inner *parent)
{
    const struct lyd_node *iter;

    if (!node || !parent) {
        return LY_SUCCESS;
    }

    if ((LYD_CTX(node) != LYD_CTX(parent))) {
        /* try to find top-level ext data parent */
        for (iter = node; iter && !(iter->flags & LYD_EXT); iter = lyd_parent(iter)) {}

        if (!iter || !lyd_parent(iter) || (LYD_CTX(lyd_parent(iter)) != LYD_CTX(parent))) {
            LOGERR(LYD_CTX(node), LY_EINVAL, "Different contexts used in node duplication.");
            return LY_EINVAL;
        }
    }

    return LY_SUCCESS;
}